

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# architecture.cc
# Opt level: O2

void __thiscall Architecture::saveXml(Architecture *this,ostream *s)

{
  int iVar1;
  allocator local_39;
  string local_38;
  
  std::operator<<(s,"<save_state");
  std::__cxx11::string::string((string *)&local_38,"loadersymbols",&local_39);
  a_v_b(s,&local_38,this->loadersymbols_parsed);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator<<(s,">\n");
  TypeFactory::saveXml(this->types,s);
  Database::saveXml(this->symboltab,s);
  (*this->context->_vptr_ContextDatabase[0xf])(this->context,s);
  (*this->commentdb->_vptr_CommentDatabase[9])(this->commentdb,s);
  iVar1 = (*this->cpool->_vptr_ConstantPool[4])();
  if ((char)iVar1 == '\0') {
    (*this->cpool->_vptr_ConstantPool[6])(this->cpool,s);
  }
  std::operator<<(s,"</save_state>\n");
  return;
}

Assistant:

void Architecture::saveXml(ostream &s) const

{
  s << "<save_state";
  a_v_b(s,"loadersymbols",loadersymbols_parsed);
  s << ">\n";
  types->saveXml(s);
  symboltab->saveXml(s);
  context->saveXml(s);
  commentdb->saveXml(s);
  if (!cpool->empty())
    cpool->saveXml(s);
  s << "</save_state>\n";
}